

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

int nonius::run_it(configuration *cfg)

{
  benchmark_registry *benchmarks;
  reporter_registry *reporters;
  configuration cStack_158;
  
  configuration::configuration(&cStack_158,cfg);
  benchmarks = global_benchmark_registry();
  reporters = global_reporter_registry_abi_cxx11_();
  go<std::chrono::_V2::system_clock>(&cStack_158,benchmarks,reporters);
  configuration::~configuration(&cStack_158);
  return 0;
}

Assistant:

inline int run_it(configuration cfg) {
        try {
            nonius::go(cfg);
        } catch(...) {
            std::cerr << "PANIC: clock is on fire\n";
            try {
                throw;
            } catch(std::exception const& e) {
                std::cerr << "  " << e.what() << "\n";
            } catch(...) {}
            return 23;
        }
        return 0;
    }